

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O1

char * read_ld_version(char *path)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  char *pcVar3;
  char version [254];
  char acStack_118 [256];
  
  memset(acStack_118,0,0xfe);
  __stream = fopen(path,"r");
  if (__stream != (FILE *)0x0) {
    do {
      while (iVar1 = fgetc(__stream), iVar1 == 0x6c) {
        pcVar3 = try_read_ld_version_string((FILE *)__stream);
        if (pcVar3 != (char *)0x0) {
          lVar2 = compare_version_strings(pcVar3,acStack_118);
          if (0 < lVar2) {
            strcpy(acStack_118,pcVar3);
          }
          free(pcVar3);
        }
      }
    } while (iVar1 != -1);
    fclose(__stream);
  }
  pcVar3 = strdup(acStack_118);
  return pcVar3;
}

Assistant:

char *read_ld_version(char *path) {
    char version[254] = {0x0};
    FILE *fp = fopen(path, "r");
    if (fp) {
        int itr;
        while ((itr = fgetc(fp)) != EOF) {
            if (itr == 'l') {
                char *new_version = try_read_ld_version_string(fp);
                if (new_version != NULL) {
                    if (compare_version_strings(new_version, version) > 0)
                        strcpy(version, new_version);

                    free(new_version);
                }
            }
        }

        fclose(fp);
    }

    return strdup(version);
}